

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this,Type type,string *message)

{
  string *message_local;
  Type type_local;
  BasicResult<Catch::clara::detail::ParseResultType> *this_local;
  
  ResultValueBase<Catch::clara::detail::ParseResultType>::ResultValueBase
            (&this->super_ResultValueBase<Catch::clara::detail::ParseResultType>,type);
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0047e830;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)message);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
      != Ok) {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/catch.hpp"
                ,0x2344,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult(ResultBase::Type, const std::string &) [T = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }